

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ibuf.c
# Opt level: O2

int main(void)

{
  slab_cache *psVar1;
  char *pcVar2;
  int iVar3;
  size_t sVar4;
  void *pvVar5;
  undefined8 *puVar6;
  size_t sVar7;
  ulong uVar8;
  undefined8 uStackY_70;
  undefined1 local_60 [8];
  ibuf ibuf;
  
  plan(6);
  _space(_stdout);
  printf("# *** %s ***\n","main");
  quota.value = 0x40000000000000;
  slab_arena_create(&arena,&quota,0,4000000,2);
  slab_cache_create(&cache,&arena);
  plan(6);
  _space(_stdout);
  printf("# *** %s ***\n","test_ibuf_basic");
  ibuf_create((ibuf *)local_60,&cache,0x3fc0);
  sVar4 = ibuf_used((ibuf *)local_60);
  _ok((uint)(sVar4 == 0),"ibuf_used(&ibuf) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x14,
      "line %d",0x14);
  pvVar5 = ibuf_alloc((ibuf *)local_60,10);
  _ok((uint)(pvVar5 != (void *)0x0),"ptr != NULL",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x16,
      "line %d",0x16);
  sVar4 = ibuf_used((ibuf *)local_60);
  _ok((uint)(sVar4 == 10),"ibuf_used(&ibuf) == 10",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x17,
      "line %d",0x17);
  pvVar5 = ibuf_alloc((ibuf *)local_60,1000000);
  _ok((uint)(pvVar5 != (void *)0x0),"ptr != NULL",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x1a,
      "line %d",0x1a);
  sVar4 = ibuf_used((ibuf *)local_60);
  _ok((uint)(sVar4 == 0xf424a),"ibuf_used(&ibuf) == 1000010",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x1b,
      "line %d",0x1b);
  ibuf.rpos = (char *)ibuf.slabc;
  ibuf.buf = (char *)ibuf.slabc;
  sVar4 = ibuf_used((ibuf *)local_60);
  _ok((uint)(sVar4 == 0),"ibuf_used(&ibuf) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x1e,
      "line %d",0x1e);
  ibuf_destroy((ibuf *)local_60);
  _space(_stdout);
  printf("# *** %s: done ***\n","test_ibuf_basic");
  check_plan();
  plan(0xc);
  _space(_stdout);
  printf("# *** %s ***\n","test_ibuf_shrink");
  ibuf_create((ibuf *)local_60,&cache,0x4000);
  pvVar5 = ibuf_alloc((ibuf *)local_60,0x19000);
  _ok((uint)(pvVar5 != (void *)0x0),"ibuf_alloc(&ibuf, 100 * 1024) != NULL",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x2e,
      "line %d",0x2e);
  ibuf_consume((ibuf *)local_60,0x11800);
  ibuf_shrink((ibuf *)local_60);
  sVar4 = ibuf_used((ibuf *)local_60);
  _ok((uint)(sVar4 == 0x7800),"ibuf_used(&ibuf) == (100 - 70) * 1024",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x34,
      "line %d",0x34);
  uVar8 = (long)ibuf.wpos - (long)ibuf.slabc;
  sVar4 = ibuf_used((ibuf *)local_60);
  _ok((uint)(sVar4 <= uVar8),"ibuf_capacity(&ibuf) >= ibuf_used(&ibuf)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x35,
      "line %d",0x35);
  _ok((uint)((ulong)((long)ibuf.wpos - (long)ibuf.slabc) < 0x10000),
      "ibuf_capacity(&ibuf) < start_capacity * 4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x36,
      "line %d",0x36);
  psVar1 = ibuf.slabc;
  ibuf.buf = ibuf.buf + 1;
  ibuf_shrink((ibuf *)local_60);
  _ok((uint)(psVar1 == ibuf.slabc),"prev_buf == ibuf.buf",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x3e,
      "line %d",0x3e);
  sVar4 = ibuf_used((ibuf *)local_60);
  ibuf_consume((ibuf *)local_60,sVar4 - 1);
  ibuf_shrink((ibuf *)local_60);
  _ok((uint)(0x3fff < (ulong)((long)ibuf.wpos - (long)ibuf.slabc)),
      "ibuf_capacity(&ibuf) >= start_capacity",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x44,
      "line %d",0x44);
  _ok((uint)((ulong)((long)ibuf.wpos - (long)ibuf.slabc) < 0x8000),
      "ibuf_capacity(&ibuf) < start_capacity * 2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x45,
      "line %d",0x45);
  sVar4 = ibuf_used((ibuf *)local_60);
  ibuf_consume((ibuf *)local_60,sVar4);
  ibuf_shrink((ibuf *)local_60);
  _ok((uint)((slab_cache *)ibuf.wpos == ibuf.slabc),"ibuf_capacity(&ibuf) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x4b,
      "line %d",0x4b);
  pvVar5 = ibuf_alloc((ibuf *)local_60,0x900000);
  _ok((uint)(pvVar5 != (void *)0x0),"ibuf_alloc(&ibuf, 9 * 1024 * 1024) != NULL",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x50,
      "line %d",0x50);
  _ok((uint)((long)ibuf.wpos - (long)ibuf.slabc == 0x1000000),
      "ibuf_capacity(&ibuf) == 16 * 1024 * 1024",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x51,
      "line %d",0x51);
  ibuf_consume((ibuf *)local_60,0x200000);
  ibuf_shrink((ibuf *)local_60);
  _ok((uint)((long)ibuf.wpos - (long)ibuf.slabc == 0x700000),
      "ibuf_capacity(&ibuf) == 7 * 1024 * 1024",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x54,
      "line %d",0x54);
  psVar1 = ibuf.slabc;
  ibuf_shrink((ibuf *)local_60);
  _ok((uint)(psVar1 == ibuf.slabc),"prev_buf == ibuf.buf",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x5b,
      "line %d",0x5b);
  ibuf_destroy((ibuf *)local_60);
  _space(_stdout);
  printf("# *** %s: done ***\n","test_ibuf_shrink");
  check_plan();
  plan(4);
  _space(_stdout);
  printf("# *** %s ***\n","test_ibuf_truncate");
  ibuf_create((ibuf *)local_60,&cache,0x4000);
  ibuf_alloc((ibuf *)local_60,10);
  ibuf_consume((ibuf *)local_60,10);
  puVar6 = (undefined8 *)ibuf_alloc((ibuf *)local_60,0xc);
  if (puVar6 == (undefined8 *)0x0) {
    uStackY_70 = 0x71;
  }
  else {
    *puVar6 = 0x6548206f6c6c6548;
    *(undefined4 *)(puVar6 + 1) = 0x6f6c6c;
    sVar4 = ibuf_used((ibuf *)local_60);
    puVar6 = (undefined8 *)ibuf_alloc((ibuf *)local_60,100);
    if (puVar6 == (undefined8 *)0x0) {
      uStackY_70 = 0x79;
    }
    else {
      *puVar6 = 0x657962646f6f47;
      ibuf_truncate((ibuf *)local_60,sVar4);
      sVar7 = ibuf_used((ibuf *)local_60);
      _ok((uint)(sVar7 == sVar4),"ibuf_used(&ibuf) == svp",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x7c,
          "line %d",0x7c);
      iVar3 = strcmp(ibuf.buf,"Hello Hello");
      _ok((uint)(iVar3 == 0),"strcmp(ibuf.rpos, hello) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x7d,
          "line %d",0x7d);
      puVar6 = (undefined8 *)ibuf_alloc((ibuf *)local_60,0x8000);
      if (puVar6 != (undefined8 *)0x0) {
        *puVar6 = 0x657962646f6f47;
        ibuf_truncate((ibuf *)local_60,sVar4);
        sVar7 = ibuf_used((ibuf *)local_60);
        _ok((uint)(sVar7 == sVar4),"ibuf_used(&ibuf) == svp",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x86,
            "line %d",0x86);
        iVar3 = strcmp(ibuf.buf,"Hello Hello");
        _ok((uint)(iVar3 == 0),"strcmp(ibuf.rpos, hello) == 0",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x87,
            "line %d",0x87);
        ibuf_destroy((ibuf *)local_60);
        _space(_stdout);
        printf("# *** %s: done ***\n","test_ibuf_truncate");
        check_plan();
        plan(4);
        _space(_stdout);
        printf("# *** %s ***\n","test_ibuf_discard");
        ibuf_create((ibuf *)local_60,&cache,0x400);
        ibuf_alloc((ibuf *)local_60,0x200);
        pcVar2 = ibuf.buf;
        ibuf_discard((ibuf *)local_60,100);
        _ok((uint)(ibuf.buf == pcVar2),"ibuf.rpos == pos",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x99,
            "line %d",0x99);
        sVar4 = ibuf_used((ibuf *)local_60);
        _ok((uint)(sVar4 == 0x19c),"ibuf_used(&ibuf) == 412",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x9a,
            "line %d",0x9a);
        ibuf_discard((ibuf *)local_60,0x19c);
        _ok((uint)(ibuf.buf == pcVar2),"ibuf.rpos == pos",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x9c,
            "line %d",0x9c);
        sVar4 = ibuf_used((ibuf *)local_60);
        _ok((uint)(sVar4 == 0),"ibuf_used(&ibuf) == 0",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x9d,
            "line %d",0x9d);
        ibuf_destroy((ibuf *)local_60);
        _space(_stdout);
        printf("# *** %s: done ***\n","test_ibuf_discard");
        check_plan();
        plan(4);
        _space(_stdout);
        printf("# *** %s ***\n","test_ibuf_consume");
        ibuf_create((ibuf *)local_60,&cache,0x400);
        ibuf_alloc((ibuf *)local_60,0x200);
        pcVar2 = ibuf.rpos;
        ibuf_consume((ibuf *)local_60,200);
        _ok((uint)(ibuf.rpos == pcVar2),"ibuf.wpos == pos",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0xaf,
            "line %d",0xaf);
        sVar4 = ibuf_used((ibuf *)local_60);
        _ok((uint)(sVar4 == 0x138),"ibuf_used(&ibuf) == 312",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0xb0,
            "line %d",0xb0);
        ibuf_consume((ibuf *)local_60,0x138);
        _ok((uint)(ibuf.rpos == pcVar2),"ibuf.wpos == pos",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0xb2,
            "line %d",0xb2);
        sVar4 = ibuf_used((ibuf *)local_60);
        _ok((uint)(sVar4 == 0),"ibuf_used(&ibuf) == 0",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0xb3,
            "line %d",0xb3);
        ibuf_destroy((ibuf *)local_60);
        _space(_stdout);
        printf("# *** %s: done ***\n","test_ibuf_consume");
        check_plan();
        plan(4);
        _space(_stdout);
        printf("# *** %s ***\n","test_ibuf_consume_before");
        ibuf_create((ibuf *)local_60,&cache,0x400);
        ibuf_alloc((ibuf *)local_60,5000);
        pcVar2 = ibuf.rpos;
        ibuf_consume_before((ibuf *)local_60,ibuf.rpos + -1000);
        _ok((uint)(ibuf.rpos == pcVar2),"ibuf.wpos == pos",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0xc5,
            "line %d",0xc5);
        sVar4 = ibuf_used((ibuf *)local_60);
        _ok((uint)(sVar4 == 1000),"ibuf_used(&ibuf) == 1000",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0xc6,
            "line %d",0xc6);
        ibuf_consume_before((ibuf *)local_60,ibuf.rpos);
        _ok((uint)(ibuf.rpos == pcVar2),"ibuf.wpos == pos",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",200,
            "line %d",200);
        sVar4 = ibuf_used((ibuf *)local_60);
        _ok((uint)(sVar4 == 0),"ibuf_used(&ibuf) == 0",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0xc9,
            "line %d",0xc9);
        ibuf_destroy((ibuf *)local_60);
        _space(_stdout);
        printf("# *** %s: done ***\n","test_ibuf_consume_before");
        check_plan();
        slab_cache_destroy(&cache);
        _space(_stdout);
        printf("# *** %s: done ***\n","main");
        iVar3 = check_plan();
        return iVar3;
      }
      uStackY_70 = 0x83;
    }
  }
  fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n","ptr != NULL","false",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",
          uStackY_70,"test_ibuf_truncate");
  exit(-1);
}

Assistant:

int main()
{
#ifdef ENABLE_ASAN
	plan(7);
#else
	plan(6);
#endif
	header();

	quota_init(&quota, UINT_MAX);
	slab_arena_create(&arena, &quota, 0,
			  4000000, MAP_PRIVATE);
	slab_cache_create(&cache, &arena);

	test_ibuf_basic();
	test_ibuf_shrink();
	test_ibuf_truncate();
	test_ibuf_discard();
	test_ibuf_consume();
	test_ibuf_consume_before();
#ifdef ENABLE_ASAN
	test_ibuf_poison();
#endif

	slab_cache_destroy(&cache);

	footer();
	return check_plan();
}